

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cross_entropy_loss.cc
# Opt level: O2

void xLearn::ce_gradient_thread
               (DMatrix *matrix,Model *model,Score *score_func,bool is_norm,real_t *sum,
               size_t start_idx,size_t end_idx)

{
  vector<xLearn::Node,_std::allocator<xLearn::Node>_> *pvVar1;
  undefined8 uVar2;
  bool bVar3;
  ostream *poVar4;
  undefined7 in_register_00000009;
  size_t i;
  float fVar5;
  float fVar6;
  double dVar7;
  allocator local_9a;
  allocator local_99;
  Logger local_98;
  undefined4 local_94;
  float local_90;
  float local_8c;
  undefined1 local_88 [16];
  string local_70;
  string local_50;
  
  local_94 = (undefined4)CONCAT71(in_register_00000009,is_norm);
  if (start_idx <= end_idx) {
    *sum = 0.0;
    for (; end_idx != start_idx; start_idx = start_idx + 1) {
      local_8c = 1.0;
      if ((char)local_94 != '\0') {
        local_8c = (matrix->norm).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_start[start_idx];
      }
      pvVar1 = (matrix->row).
               super__Vector_base<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*,_std::allocator<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*>_>
               ._M_impl.super__Vector_impl_data._M_start[start_idx];
      fVar5 = local_8c;
      (*score_func->_vptr_Score[3])(score_func,pvVar1,model);
      uVar2 = vcmpss_avx512f(ZEXT816(0) << 0x40,
                             ZEXT416((uint)(matrix->Y).
                                           super__Vector_base<float,_std::allocator<float>_>._M_impl
                                           .super__Vector_impl_data._M_start[start_idx]),1);
      bVar3 = (bool)((byte)uVar2 & 1);
      fVar6 = (float)((uint)bVar3 * -0x40800000 + (uint)!bVar3 * 0x3f800000);
      local_90 = fVar5 * fVar6;
      local_88 = ZEXT416((uint)fVar6);
      fVar6 = expf(local_90);
      fVar6 = log1pf(fVar6);
      *sum = fVar6 + *sum;
      local_88._0_8_ = (double)(float)local_88._0_4_;
      fVar6 = expf(local_90);
      dVar7 = (double)local_88._0_8_ / (1.0 / (double)fVar6 + 1.0);
      (*score_func->_vptr_Score[4])
                (CONCAT44((int)((ulong)dVar7 >> 0x20),(float)dVar7),score_func,pvVar1,model);
    }
    return;
  }
  local_98.severity_ = ERR;
  std::__cxx11::string::string
            ((string *)&local_50,
             "/workspace/llm4binary/github/license_all_cmakelists_25/etveritas[P]xlearn/src/loss/cross_entropy_loss.cc"
             ,&local_99);
  std::__cxx11::string::string((string *)&local_70,"ce_gradient_thread",&local_9a);
  poVar4 = Logger::Start(ERR,&local_50,0x59,&local_70);
  poVar4 = std::operator<<(poVar4,"CHECK_GE failed ");
  poVar4 = std::operator<<(poVar4,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/etveritas[P]xlearn/src/loss/cross_entropy_loss.cc"
                          );
  poVar4 = std::operator<<(poVar4,":");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x59);
  poVar4 = std::operator<<(poVar4,"\n");
  poVar4 = std::operator<<(poVar4,"end_idx");
  poVar4 = std::operator<<(poVar4," = ");
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  poVar4 = std::operator<<(poVar4,"\n");
  poVar4 = std::operator<<(poVar4,"start_idx");
  poVar4 = std::operator<<(poVar4," = ");
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  std::operator<<(poVar4,"\n");
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  Logger::~Logger(&local_98);
  abort();
}

Assistant:

static void ce_gradient_thread(const DMatrix* matrix,
                               Model* model,
                               Score* score_func,
                               bool is_norm,
                               real_t* sum,
                               size_t start_idx,
                               size_t end_idx) {
  CHECK_GE(end_idx, start_idx);
  *sum = 0;
  for (size_t i = start_idx; i < end_idx; ++i) {
    SparseRow* row = matrix->row[i];
    real_t norm = is_norm ? matrix->norm[i] : 1.0;
    real_t pred = score_func->CalcScore(row, *model, norm);
    // partial gradient
    real_t y = matrix->Y[i] > 0 ? 1.0 : -1.0;
    *sum += log1p(exp(-y*pred));
    real_t pg = -y/(1.0+(1.0/exp(-y*pred)));
    // real gradient and update
    score_func->CalcGrad(row, *model, pg, norm);
  }
}